

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Inst::PrintBytes<UnifiedRegex::ScannersMixin>
          (Inst *this,DebugWriter *w,Inst *inst,ScannersMixin *that,char16 *annotation)

{
  ScannersMixin *pSVar1;
  long lVar2;
  
  DebugWriter::Print(w,L"0x%p[+0x%03x](0x%03x) [%s]:",that,(long)that - (long)inst,0xc,annotation);
  for (lVar2 = 0; pSVar1 = (ScannersMixin *)((long)&that->numLiterals + lVar2), pSVar1 < that + 1;
      lVar2 = lVar2 + 1) {
    if (((int)lVar2 - 0xcU & 3) == 0) {
      DebugWriter::Print(w,L" ",(ulong)(byte)pSVar1->numLiterals);
    }
    DebugWriter::Print(w,L"%02x",(ulong)(byte)pSVar1->numLiterals);
  }
  DebugWriter::PrintEOL(w,L"");
  return;
}

Assistant:

void Inst::PrintBytes(DebugWriter *w, Inst *inst, T *that, const char16 *annotation) const
    {
        T *start = (T*)that;
        byte *startByte = (byte *)start;
        byte *baseByte = (byte *)inst;
        ptrdiff_t offset = startByte - baseByte;
        size_t size = sizeof(*((T *)that));
        byte *endByte = startByte + size;
        byte *currentByte = startByte;
        w->Print(_u("0x%p[+0x%03x](0x%03x) [%s]:"), startByte, offset, size, annotation);

        for (; currentByte < endByte; ++currentByte)
        {
            if ((currentByte - endByte) % 4 == 0)
            {
                w->Print(_u(" "), *currentByte);
            }
            w->Print(_u("%02x"), *currentByte);
        }
        w->PrintEOL(_u(""));
    }